

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecUtil.c
# Opt level: O2

void Gia_PolynAnalyzeXors(Gia_Man_t *pGia,int fVerbose)

{
  int iObj;
  Vec_Int_t *p;
  Gia_Obj_t *pObj;
  uint uVar1;
  uint v;
  
  p = Vec_IntAlloc(100);
  if (pGia->pMuxes != (uint *)0x0) {
    uVar1 = 0;
    for (v = 0; (int)v < pGia->vCos->nSize; v = v + 1) {
      pObj = Gia_ManCo(pGia,v);
      iObj = Gia_ObjFaninId0p(pGia,pObj);
      p->nSize = 0;
      Gia_ManIncrementTravId(pGia);
      Gia_PolynCollectXors_rec(pGia,iObj,p);
      printf("%d=%d  ",(ulong)v,(ulong)(uint)p->nSize);
      uVar1 = uVar1 + p->nSize;
    }
    printf("Total = %d.\n",(ulong)uVar1);
    Vec_IntFree(p);
    return;
  }
  puts("AIG does not have XORs extracted.");
  return;
}

Assistant:

void Gia_PolynAnalyzeXors( Gia_Man_t * pGia, int fVerbose )
{
    int i, iDriver, Count = 0;
    Vec_Int_t * vXors = Vec_IntAlloc( 100 );
    if ( pGia->pMuxes == NULL )
    {
        printf( "AIG does not have XORs extracted.\n" );
        return;
    }
    assert( pGia->pMuxes );
    Gia_ManForEachCoDriverId( pGia, iDriver, i )
    {
        Vec_IntClear( vXors );
        Gia_ManIncrementTravId( pGia );
        Gia_PolynCollectXors_rec( pGia, iDriver, vXors );
        //printf( "%3d : ", i );
        //Vec_IntPrint( vXors );
        printf( "%d=%d  ", i, Vec_IntSize(vXors) );
        Count += Vec_IntSize(vXors);
    }
    printf( "Total = %d.\n", Count );
    Vec_IntFree( vXors );
}